

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O0

int __thiscall HydEngine::open(HydEngine *this,char *__file,int __oflag,...)

{
  MatrixSolver *pMVar1;
  SystemError *pSVar2;
  HydSolver *pHVar3;
  undefined1 local_68 [48];
  Network *local_18;
  Network *nw_local;
  HydEngine *this_local;
  
  local_18 = (Network *)__file;
  nw_local = (Network *)this;
  if (this->engineState != CLOSED) {
    close(this,(int)__file);
  }
  this->network = local_18;
  Network::createHeadLossModel(this->network);
  Network::createDemandModel(this->network);
  Network::createLeakageModel(this->network);
  Network::option_abi_cxx11_((Network *)&stack0xffffffffffffffc8,(StringOption)this->network);
  pMVar1 = MatrixSolver::factory
                     ((string *)&stack0xffffffffffffffc8,(ostream *)&this->network->msgLog);
  this->matrixSolver = pMVar1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  if (this->matrixSolver == (MatrixSolver *)0x0) {
    pSVar2 = (SystemError *)__cxa_allocate_exception(0x30);
    SystemError::SystemError(pSVar2,6);
    __cxa_throw(pSVar2,&SystemError::typeinfo,SystemError::~SystemError);
  }
  initMatrixSolver(this);
  Network::option_abi_cxx11_((Network *)local_68,(StringOption)this->network);
  pHVar3 = HydSolver::factory((string *)local_68,this->network,this->matrixSolver);
  this->hydSolver = pHVar3;
  std::__cxx11::string::~string((string *)local_68);
  if (this->hydSolver == (HydSolver *)0x0) {
    pSVar2 = (SystemError *)__cxa_allocate_exception(0x30);
    SystemError::SystemError(pSVar2,7);
    __cxa_throw(pSVar2,&SystemError::typeinfo,SystemError::~SystemError);
  }
  this->engineState = OPENED;
  return (int)this;
}

Assistant:

void HydEngine::open(Network* nw)
{
    // ... close a currently opened engine

    if (engineState != HydEngine::CLOSED) close();
    network = nw;

    // ... create hydraulic sub-models (can throw exception)

    network->createHeadLossModel();
    network->createDemandModel();
    network->createLeakageModel();

    // ... create and initialize a matrix solver

    matrixSolver = MatrixSolver::factory(
        network->option(Options::MATRIX_SOLVER), network->msgLog);
    if ( matrixSolver == nullptr )
    {
        throw SystemError(SystemError::MATRIX_SOLVER_NOT_OPENED);
    }
    initMatrixSolver();

    // ... create a hydraulic solver

    hydSolver = HydSolver::factory(
        network->option(Options::HYD_SOLVER), network, matrixSolver);
    if ( hydSolver == nullptr )
    {
        throw SystemError(SystemError::HYDRAULIC_SOLVER_NOT_OPENED);
    }
    engineState = HydEngine::OPENED;
}